

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCheckLanguageID(xmlChar *lang)

{
  bool bVar1;
  byte *pbVar2;
  byte *local_28;
  xmlChar *nxt;
  xmlChar *cur;
  xmlChar *lang_local;
  
  if (lang == (xmlChar *)0x0) {
    return 0;
  }
  if (((((*lang == 'i') && (lang[1] == '-')) || ((*lang == 'I' && (lang[1] == '-')))) ||
      ((*lang == 'x' && (lang[1] == '-')))) || ((local_28 = lang, *lang == 'X' && (lang[1] == '-')))
     ) {
    nxt = lang + 2;
    while( true ) {
      if (((*nxt < 0x41) || (bVar1 = true, 0x5a < *nxt)) && (bVar1 = false, 0x60 < *nxt)) {
        bVar1 = *nxt < 0x7b;
      }
      if (!bVar1) break;
      nxt = nxt + 1;
    }
    return (uint)(*nxt == '\0');
  }
  while( true ) {
    if (((*local_28 < 0x41) || (bVar1 = true, 0x5a < *local_28)) &&
       (bVar1 = false, 0x60 < *local_28)) {
      bVar1 = *local_28 < 0x7b;
    }
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  if (3 < (long)local_28 - (long)lang) {
    if (((long)local_28 - (long)lang < 9) && (*local_28 == 0)) {
      return 1;
    }
    return 0;
  }
  if ((long)local_28 - (long)lang < 2) {
    return 0;
  }
  if (*local_28 == 0) {
    return 1;
  }
  if (*local_28 != 0x2d) {
    return 0;
  }
  pbVar2 = local_28 + 1;
  local_28 = pbVar2;
  if ((*pbVar2 < 0x30) || (0x39 < *pbVar2)) {
    while( true ) {
      if (((*local_28 < 0x41) || (bVar1 = true, 0x5a < *local_28)) &&
         (bVar1 = false, 0x60 < *local_28)) {
        bVar1 = *local_28 < 0x7b;
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
    if ((long)local_28 - (long)pbVar2 == 4) {
LAB_0013a5fe:
      if (*local_28 == 0) {
        return 1;
      }
      if (*local_28 != 0x2d) {
        return 0;
      }
      pbVar2 = local_28 + 1;
      local_28 = pbVar2;
      if ((0x2f < *pbVar2) && (*pbVar2 < 0x3a)) goto LAB_0013a804;
      while( true ) {
        if (((*local_28 < 0x41) || (bVar1 = true, 0x5a < *local_28)) &&
           (bVar1 = false, 0x60 < *local_28)) {
          bVar1 = *local_28 < 0x7b;
        }
        if (!bVar1) break;
        local_28 = local_28 + 1;
      }
      if ((4 < (long)local_28 - (long)pbVar2) && ((long)local_28 - (long)pbVar2 < 9))
      goto LAB_0013a7d1;
      if ((long)local_28 - (long)pbVar2 != 2) {
        return 0;
      }
    }
    else if ((long)local_28 - (long)pbVar2 != 2) {
      if ((4 < (long)local_28 - (long)pbVar2) && ((long)local_28 - (long)pbVar2 < 9))
      goto LAB_0013a7d1;
      if ((long)local_28 - (long)pbVar2 != 3) {
        return 0;
      }
      if (*local_28 == 0) {
        return 1;
      }
      if (*local_28 != 0x2d) {
        return 0;
      }
      pbVar2 = local_28 + 1;
      local_28 = pbVar2;
      if ((0x2f < *pbVar2) && (*pbVar2 < 0x3a)) goto LAB_0013a804;
      while( true ) {
        if (((*local_28 < 0x41) || (bVar1 = true, 0x5a < *local_28)) &&
           (bVar1 = false, 0x60 < *local_28)) {
          bVar1 = *local_28 < 0x7b;
        }
        if (!bVar1) break;
        local_28 = local_28 + 1;
      }
      if ((long)local_28 - (long)pbVar2 != 2) {
        if ((4 < (long)local_28 - (long)pbVar2) && ((long)local_28 - (long)pbVar2 < 9))
        goto LAB_0013a7d1;
        if ((long)local_28 - (long)pbVar2 != 4) {
          return 0;
        }
        goto LAB_0013a5fe;
      }
    }
  }
  else {
LAB_0013a804:
    if ((((local_28[1] < 0x30) || (0x39 < local_28[1])) || (local_28[2] < 0x30)) ||
       (0x39 < local_28[2])) {
      return 0;
    }
    local_28 = local_28 + 3;
  }
  if (*local_28 == 0) {
    return 1;
  }
  if (*local_28 != 0x2d) {
    return 0;
  }
  pbVar2 = local_28 + 1;
  local_28 = pbVar2;
  while( true ) {
    if (((*local_28 < 0x41) || (bVar1 = true, 0x5a < *local_28)) &&
       (bVar1 = false, 0x60 < *local_28)) {
      bVar1 = *local_28 < 0x7b;
    }
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  if (((long)local_28 - (long)pbVar2 < 5) || (8 < (long)local_28 - (long)pbVar2)) {
    return 0;
  }
LAB_0013a7d1:
  if (*local_28 == 0) {
    lang_local._4_4_ = 1;
  }
  else if (*local_28 == 0x2d) {
    lang_local._4_4_ = 1;
  }
  else {
    lang_local._4_4_ = 0;
  }
  return lang_local._4_4_;
}

Assistant:

int
xmlCheckLanguageID(const xmlChar * lang)
{
    const xmlChar *cur = lang, *nxt;

    if (cur == NULL)
        return (0);
    if (((cur[0] == 'i') && (cur[1] == '-')) ||
        ((cur[0] == 'I') && (cur[1] == '-')) ||
        ((cur[0] == 'x') && (cur[1] == '-')) ||
        ((cur[0] == 'X') && (cur[1] == '-'))) {
        /*
         * Still allow IANA code and user code which were coming
         * from the previous version of the XML-1.0 specification
         * it's deprecated but we should not fail
         */
        cur += 2;
        while (((cur[0] >= 'A') && (cur[0] <= 'Z')) ||
               ((cur[0] >= 'a') && (cur[0] <= 'z')))
            cur++;
        return(cur[0] == 0);
    }
    nxt = cur;
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur >= 4) {
        /*
         * Reserved
         */
        if ((nxt - cur > 8) || (nxt[0] != 0))
            return(0);
        return(1);
    }
    if (nxt - cur < 2)
        return(0);
    /* we got an ISO 639 code */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have extlang or script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 4)
        goto script;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 3)
        return(0);
    /* we parsed an extlang */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 4)
        return(0);
    /* we parsed a script */
script:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 2)
        return(0);
    /* we parsed a region */
region:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can just have a variant */
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur < 5) || (nxt - cur > 8))
        return(0);

    /* we parsed a variant */
variant:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);
    /* extensions and private use subtags not checked */
    return (1);

region_m49:
    if (((nxt[1] >= '0') && (nxt[1] <= '9')) &&
        ((nxt[2] >= '0') && (nxt[2] <= '9'))) {
        nxt += 3;
        goto region;
    }
    return(0);
}